

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::log_message(ConsoleReporter *this,MessageData *mb)

{
  char *pcVar1;
  ostream *poVar2;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  std::mutex::lock(&this->mutex);
  logTestStart(this);
  (*(this->super_IReporter)._vptr_IReporter[0xe])(this,mb->m_file,(ulong)(uint)mb->m_line," ");
  poVar2 = this->s;
  Color::operator<<(poVar2,(mb->m_severity & is_warn) * 4 + Red);
  if ((mb->m_severity & is_warn) == 0) {
    pcVar1 = failureString(mb->m_severity);
  }
  else {
    pcVar1 = "MESSAGE";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,": ");
  poVar2 = this->s;
  Color::operator<<(poVar2,None);
  poVar2 = doctest::operator<<(poVar2,&mb->m_string);
  std::operator<<(poVar2,"\n");
  log_contexts(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            if(tc->m_no_output)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            logTestStart();

            file_line_to_stream(mb.m_file, mb.m_line, " ");
            s << getSuccessOrFailColor(false, mb.m_severity)
              << getSuccessOrFailString(mb.m_severity & assertType::is_warn, mb.m_severity,
                                        "MESSAGE") << ": ";
            s << Color::None << mb.m_string << "\n";
            log_contexts();
        }